

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void OnSetTriggerCtx(ecs_iter_t *it)

{
  int count;
  EcsTrigger *ct;
  void *pvVar1;
  void **ppvVar2;
  long lVar3;
  
  ct = (EcsTrigger *)ecs_column_w_size(it,0x28,1);
  pvVar1 = ecs_column_w_size(it,8,2);
  count = it->count;
  if (0 < (long)count) {
    ppvVar2 = &ct->ctx;
    lVar3 = 0;
    do {
      *ppvVar2 = *(void **)((long)pvVar1 + lVar3 * 8);
      lVar3 = lVar3 + 1;
      ppvVar2 = ppvVar2 + 5;
    } while (count != lVar3);
  }
  trigger_set(it->world,it->entities,ct,count);
  return;
}

Assistant:

static
void OnSetTriggerCtx(
    ecs_iter_t *it)
{
    EcsTrigger *ct = ecs_column(it, EcsTrigger, 1);
    EcsContext *ctx = ecs_column(it, EcsContext, 2);

    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ct[i].ctx = (void*)ctx[i].ctx;
    }

    trigger_set(it->world, it->entities, ct, it->count);    
}